

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutable_s2shape_index.cc
# Opt level: O0

ClippedEdge *
MutableS2ShapeIndex::UpdateBound
          (ClippedEdge *edge,int u_end,double u,int v_end,double v,EdgeAllocator *alloc)

{
  EdgeAllocator *pEVar1;
  bool bVar2;
  R1Interval *pRVar3;
  double *pdVar4;
  ostream *poVar5;
  double dVar6;
  S2LogMessage local_80;
  S2LogMessageVoidify local_6d [20];
  byte local_59;
  S2LogMessage local_58;
  S2LogMessageVoidify local_41;
  ClippedEdge *local_40;
  ClippedEdge *clipped;
  EdgeAllocator *alloc_local;
  double v_local;
  double dStack_20;
  int v_end_local;
  double u_local;
  ClippedEdge *pCStack_10;
  int u_end_local;
  ClippedEdge *edge_local;
  
  clipped = (ClippedEdge *)alloc;
  alloc_local = (EdgeAllocator *)v;
  v_local._4_4_ = v_end;
  dStack_20 = u;
  u_local._4_4_ = u_end;
  pCStack_10 = edge;
  local_40 = EdgeAllocator::NewClippedEdge(alloc);
  dVar6 = dStack_20;
  local_40->face_edge = pCStack_10->face_edge;
  pRVar3 = R2Rect::operator[](&local_40->bound,0);
  pdVar4 = R1Interval::operator[](pRVar3,u_local._4_4_);
  pEVar1 = alloc_local;
  *pdVar4 = dVar6;
  pRVar3 = R2Rect::operator[](&local_40->bound,1);
  pdVar4 = R1Interval::operator[](pRVar3,v_local._4_4_);
  *pdVar4 = (double)pEVar1;
  pRVar3 = R2Rect::operator[](&pCStack_10->bound,0);
  dVar6 = R1Interval::operator[](pRVar3,1 - u_local._4_4_);
  pRVar3 = R2Rect::operator[](&local_40->bound,0);
  pdVar4 = R1Interval::operator[](pRVar3,1 - u_local._4_4_);
  *pdVar4 = dVar6;
  pRVar3 = R2Rect::operator[](&pCStack_10->bound,1);
  dVar6 = R1Interval::operator[](pRVar3,1 - v_local._4_4_);
  pRVar3 = R2Rect::operator[](&local_40->bound,1);
  pdVar4 = R1Interval::operator[](pRVar3,1 - v_local._4_4_);
  *pdVar4 = dVar6;
  bVar2 = R2Rect::is_empty(&local_40->bound);
  local_59 = 0;
  if (bVar2) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_58,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/mutable_s2shape_index.cc"
               ,0x4d6,kFatal,(ostream *)&std::cerr);
    local_59 = 1;
    poVar5 = S2LogMessage::stream(&local_58);
    poVar5 = std::operator<<(poVar5,"Check failed: !clipped->bound.is_empty() ");
    S2LogMessageVoidify::operator&(&local_41,poVar5);
  }
  if ((local_59 & 1) != 0) {
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_58);
  }
  bVar2 = R2Rect::Contains(&pCStack_10->bound,&local_40->bound);
  if (((bVar2 ^ 0xffU) & 1) != 0) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_80,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/mutable_s2shape_index.cc"
               ,0x4d7,kFatal,(ostream *)&std::cerr);
    poVar5 = S2LogMessage::stream(&local_80);
    poVar5 = std::operator<<(poVar5,"Check failed: edge->bound.Contains(clipped->bound) ");
    S2LogMessageVoidify::operator&(local_6d,poVar5);
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_80);
  }
  return local_40;
}

Assistant:

inline const MutableS2ShapeIndex::ClippedEdge*
MutableS2ShapeIndex::UpdateBound(const ClippedEdge* edge, int u_end, double u,
                                 int v_end, double v, EdgeAllocator* alloc) {
  ClippedEdge* clipped = alloc->NewClippedEdge();
  clipped->face_edge = edge->face_edge;
  clipped->bound[0][u_end] = u;
  clipped->bound[1][v_end] = v;
  clipped->bound[0][1-u_end] = edge->bound[0][1-u_end];
  clipped->bound[1][1-v_end] = edge->bound[1][1-v_end];
  S2_DCHECK(!clipped->bound.is_empty());
  S2_DCHECK(edge->bound.Contains(clipped->bound));
  return clipped;
}